

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O2

void __thiscall Kernel::UnstableVarIt::UnstableVarIt(UnstableVarIt *this,Term *t)

{
  Stack<bool> *this_00;
  Stack<Kernel::TermList> *this_01;
  
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__UnstableVarIt_009ff9c8;
  (this->_next)._content = 2;
  this_00 = &this->_stable;
  Lib::Stack<bool>::Stack(this_00,8);
  this_01 = &this->_stack;
  Lib::Stack<Kernel::TermList>::Stack(this_01,8);
  (this->_next)._content = 2;
  if ((t->_args[0]._content & 0x10) == 0) {
    Lib::Stack<bool>::push(this_00,true);
    Lib::Stack<Kernel::TermList>::push(this_01,(TermList)t);
  }
  else {
    Lib::Stack<Kernel::TermList>::push
              (this_01,(TermList)t->_args[*(uint *)&t->field_0xc & 0xfffffff]._content);
    Lib::Stack<Kernel::TermList>::push
              (this_01,(TermList)t->_args[(ulong)(*(uint *)&t->field_0xc & 0xfffffff) - 1]._content)
    ;
    Lib::Stack<bool>::push(this_00,true);
    Lib::Stack<bool>::push(this_00,true);
  }
  return;
}

Assistant:

UnstableVarIt(Term* t) : _stable(8), _stack(8)
  {
    _next = TermList::empty();
    if(t->isLiteral()){
      _stack.push(*t->nthArgument(0));
      _stack.push(*t->nthArgument(1));
      _stable.push(true);
      _stable.push(true);   
      return;      
    }
    _stable.push(true);
    _stack.push(TermList(t)); 
  }